

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::bitcast_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,BaseType target_type,uint32_t arg)

{
  SPIRType *pSVar1;
  char (*in_R9) [2];
  diligent_spirv_cross local_1d0 [32];
  string local_1b0;
  undefined1 local_190 [8];
  SPIRType target;
  SPIRType *src_type;
  uint32_t arg_local;
  BaseType target_type_local;
  CompilerGLSL *this_local;
  string *expr;
  
  to_expression_abi_cxx11_(__return_storage_ptr__,this,arg,true);
  pSVar1 = Compiler::expression_type(&this->super_Compiler,arg);
  if (pSVar1->basetype != target_type) {
    SPIRType::SPIRType((SPIRType *)local_190,pSVar1);
    target.super_IVariant.self.id = target_type;
    (*(this->super_Compiler)._vptr_Compiler[0x3c])(local_1d0,this,local_190,pSVar1);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_1b0,local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe5b075,
               (char (*) [2])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf65f2d,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1b0);
    ::std::__cxx11::string::~string((string *)&local_1b0);
    ::std::__cxx11::string::~string((string *)local_1d0);
    SPIRType::~SPIRType((SPIRType *)local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::bitcast_expression(SPIRType::BaseType target_type, uint32_t arg)
{
	auto expr = to_expression(arg);
	auto &src_type = expression_type(arg);
	if (src_type.basetype != target_type)
	{
		auto target = src_type;
		target.basetype = target_type;
		expr = join(bitcast_glsl_op(target, src_type), "(", expr, ")");
	}

	return expr;
}